

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_chi2_test<trng::cauchy_dist<long_double>>(cauchy_dist<long_double> *d)

{
  bool bVar1;
  parameter_type P;
  undefined1 x_00 [16];
  StringRef capturedExpression;
  ExprLhs<bool> EVar2;
  reference pvVar3;
  reference pvVar4;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  longdouble lVar5;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 Var6;
  unkbyte10 in_ST6;
  unkbyte10 Var7;
  AssertionHandler catchAssertionHandler;
  double c2_p;
  vector<double,_std::allocator<double>_> p;
  int bin;
  result_type x;
  int i_1;
  lcg64_shift R;
  int i;
  vector<int,_std::allocator<int>_> count;
  vector<long_double,_std::allocator<long_double>_> quantil;
  int N;
  result_type dp;
  int bins;
  undefined4 in_stack_fffffffffffffe08;
  Flags in_stack_fffffffffffffe0c;
  undefined2 in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe12;
  lcg64_shift *in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  undefined1 uVar8;
  size_type in_stack_fffffffffffffe28;
  SourceLineInfo *this;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe30;
  double dVar9;
  cauchy_dist<long_double> *in_stack_fffffffffffffe38;
  ExprLhs<bool> *expr;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined6 uStack_1b8;
  undefined2 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5a;
  undefined4 in_stack_fffffffffffffe5c;
  undefined6 in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe66;
  SourceLineInfo local_178;
  StringRef local_168;
  double local_110;
  ExprLhs<bool> local_101;
  undefined8 local_100;
  int local_dc;
  unkbyte10 local_d8;
  int local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int local_78;
  undefined4 local_64;
  vector<int,_std::allocator<int>_> local_60;
  vector<long_double,_std::allocator<long_double>_> local_48;
  undefined4 local_2c;
  longdouble local_28;
  undefined4 local_c;
  
  local_c = 0x80;
  local_28 = (longdouble)0.0078125;
  local_2c = 10000;
  Var7 = in_ST6;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)0x36b9df);
  local_64 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x36b9fc);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,
             (value_type_conflict3 *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
             (allocator_type *)in_stack_fffffffffffffe18);
  std::allocator<int>::~allocator((allocator<int> *)0x36ba2a);
  for (local_78 = 1; local_78 < 0x80; local_78 = local_78 + 1) {
    lVar5 = (longdouble)0.0078125 * (longdouble)local_78;
    in_stack_fffffffffffffe08 = SUB104(lVar5,0);
    in_stack_fffffffffffffe0c = (Flags)((unkuint10)lVar5 >> 0x20);
    in_stack_fffffffffffffe10 = (undefined2)((unkuint10)lVar5 >> 0x40);
    x_00[6] = in_stack_fffffffffffffe26;
    x_00._0_6_ = in_stack_fffffffffffffe20;
    x_00[7] = in_stack_fffffffffffffe27;
    x_00._8_8_ = in_stack_fffffffffffffe28;
    Var6 = in_ST5;
    in_ST6 = in_ST5;
    trng::cauchy_dist<long_double>::icdf(in_stack_fffffffffffffe38,(result_type_conflict3)x_00);
    in_stack_fffffffffffffe5c = (undefined4)in_ST0;
    in_stack_fffffffffffffe60 = (undefined6)((unkuint10)in_ST0 >> 0x20);
    Var7 = in_ST6;
    std::vector<long_double,_std::allocator<long_double>_>::push_back
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10),
               (value_type_conflict7 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
              );
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = Var6;
  }
  local_b8 = trng::lcg64_shift::Default;
  uStack_b0 = DAT_005526e8;
  P.a._4_4_ = in_stack_fffffffffffffe0c;
  P.a._0_4_ = in_stack_fffffffffffffe08;
  P.b._0_2_ = in_stack_fffffffffffffe10;
  P.b._2_6_ = in_stack_fffffffffffffe12;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)0x36bb1a,P);
  for (local_bc = 0; local_bc < 10000; local_bc = local_bc + 1) {
    trng::cauchy_dist<long_double>::operator()
              ((cauchy_dist<long_double> *)
               CONCAT17(in_stack_fffffffffffffe27,
                        CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
               in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe58 = (undefined2)((unkuint10)in_ST0 >> 0x40);
    local_dc = 0;
    Var6 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = Var7;
    local_d8 = in_ST0;
    while( true ) {
      in_ST0 = Var6;
      bVar1 = false;
      if (local_dc < 0x7f) {
        in_stack_fffffffffffffe44 = (undefined4)local_d8;
        uStack_1b8 = (undefined6)((unkuint10)local_d8 >> 0x20);
        pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (&local_48,(long)local_dc);
        bVar1 = *(longdouble *)pvVar3 < (longdouble)CONCAT64(uStack_1b8,in_stack_fffffffffffffe44);
        in_ST6 = in_ST5;
        Var7 = in_ST5;
      }
      if (!bVar1) break;
      local_dc = local_dc + 1;
      Var6 = in_ST0;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)local_dc);
    *pvVar4 = *pvVar4 + 1;
  }
  local_100 = 0x3f80000000000000;
  expr = &local_101;
  std::allocator<double>::allocator((allocator<double> *)0x36bc1f);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (value_type_conflict6 *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
             (allocator_type *)in_stack_fffffffffffffe18);
  std::allocator<double>::~allocator((allocator<double> *)0x36bc4d);
  dVar9 = chi_percentil((vector<double,_std::allocator<double>_> *)
                        CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60),
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffe5c,
                                 CONCAT22(in_stack_fffffffffffffe5a,in_stack_fffffffffffffe58)));
  local_110 = dVar9;
  local_168 = operator____catch_sr
                        ((char *)CONCAT62(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10),
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  this = &local_178;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xc2);
  Catch::StringRef::StringRef
            ((StringRef *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
             (char *)in_stack_fffffffffffffe18);
  capturedExpression.m_size = (size_type)dVar9;
  capturedExpression.m_start = (char *)this;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
             (StringRef *)in_stack_fffffffffffffe18,
             (SourceLineInfo *)CONCAT62(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10),
             capturedExpression,in_stack_fffffffffffffe0c);
  uVar8 = 0.01 < local_110 && local_110 < 0.99;
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),expr)
  ;
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(uVar8,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffe20)));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(uVar8,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffe20)));
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)
             CONCAT17(uVar8,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffe20)));
  return;
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}